

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  Option *pOVar1;
  pointer *pppOVar2;
  pointer *pppAVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pbVar5;
  pointer pcVar6;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var7;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var8;
  Option *pOVar9;
  iterator iVar10;
  pointer psVar11;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar12;
  iterator __position;
  element_type *peVar13;
  App *pAVar14;
  bool bVar15;
  type_conflict tVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  Classifier CVar20;
  int iVar21;
  Option_p *opt;
  HorribleError *pHVar22;
  long *plVar23;
  pointer puVar24;
  undefined8 *puVar25;
  pointer psVar26;
  ArgumentMismatch *pAVar27;
  ulong *puVar28;
  int num;
  App *pAVar29;
  uint uVar30;
  undefined8 uVar31;
  long lVar32;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar33;
  ulong uVar34;
  int t;
  App *sub;
  string nvalue;
  string arg_name;
  string current;
  string rest;
  string value;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_3f0;
  undefined1 local_3e0 [32];
  App *local_3c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_3b8;
  App *local_3b0;
  undefined1 local_3a8 [36];
  int local_384;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_380;
  string local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  char local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined2 local_2e8;
  undefined6 uStack_2e6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [16];
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [16];
  anon_class_32_1_6b09f7e2_for__M_pred local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  char local_148 [16];
  Classifier local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_338._M_allocated_capacity = (size_type)local_328;
  pcVar6 = pbVar5[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,pcVar6,pcVar6 + pbVar5[-1]._M_string_length);
  local_358._M_allocated_capacity = (size_type)&local_348;
  local_358._8_8_ = 0;
  local_348._M_local_buf[0] = '\0';
  local_2d8._M_allocated_capacity = (size_type)&local_2c8;
  local_2d8._8_8_ = 0;
  local_2c8._M_local_buf[0] = '\0';
  local_318._M_allocated_capacity = (size_type)&local_308;
  local_318._8_8_ = (char *)0x0;
  local_308._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    if (((((ulong)local_338._8_8_ < 2) || (*(char *)local_338._M_allocated_capacity != '-')) ||
        (*(byte *)(local_338._M_allocated_capacity + 1) == 0x2d)) ||
       (*(byte *)(local_338._M_allocated_capacity + 1) < 0x22)) {
      pHVar22 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar22,&local_f0);
      __cxa_throw(pHVar22,&HorribleError::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_338);
    ::std::__cxx11::string::operator=((string *)local_358._M_local_buf,(string *)local_3e0);
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
    ::std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_338);
    ::std::__cxx11::string::operator=((string *)local_318._M_local_buf,(string *)local_3e0);
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
  }
  else if (current_type == WINDOWS_STYLE) {
    bVar15 = detail::split_windows_style
                       ((string *)&local_338,(string *)&local_358,(string *)&local_2d8);
    if (!bVar15) {
      pHVar22 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"windows option parsed but missing! You should not see this",
                 "");
      HorribleError::HorribleError(pHVar22,&local_110);
      __cxa_throw(pHVar22,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar22 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar22,&local_130);
      __cxa_throw(pHVar22,&HorribleError::typeinfo,Error::~Error);
    }
    bVar15 = detail::split_long((string *)&local_338,(string *)&local_358,(string *)&local_2d8);
    if (!bVar15) {
      pHVar22 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar22,&local_50);
      __cxa_throw(pHVar22,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var7._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var8._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_158._M_allocated_capacity = (size_type)local_148;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,local_358._M_allocated_capacity,
             local_358._8_8_ + local_358._M_allocated_capacity);
  local_138 = current_type;
  local_3f0 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (_Var7,_Var8,(anon_class_40_2_a297e68f_for__M_pred *)&local_158);
  if ((char *)local_158._M_allocated_capacity != local_148) {
    operator_delete((void *)local_158._M_allocated_capacity);
  }
  local_3c0 = this;
  local_3b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args;
  if (local_3f0 !=
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00132d38:
    pvVar33 = local_3b8;
    pbVar5 = *(pointer *)(local_3b8 + 8);
    *(pointer *)(local_3b8 + 8) = pbVar5 + -1;
    pcVar6 = pbVar5[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &pbVar5[-1].field_2) {
      operator_delete(pcVar6);
    }
    pOVar9 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (((pOVar9->inject_separator_ == true) &&
        (pbVar5 = *(pointer *)
                   ((long)&(pOVar9->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   + 8),
        (pOVar9->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar5)) && (pbVar5[-1]._M_string_length != 0))
    {
      local_178._8_8_ = 0;
      local_168._M_local_buf[0] = '\0';
      local_178._M_allocated_capacity = (size_type)&local_168;
      Option::_add_result(pOVar9,(string *)&local_178,&pOVar9->results_);
      pOVar9->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_allocated_capacity != &local_168) {
        operator_delete((void *)local_178._M_allocated_capacity);
      }
    }
    pOVar9 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((pOVar9->trigger_on_result_ == true) && (pOVar9->current_option_state_ == callback_run)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&pOVar9->results_);
      pOVar9->current_option_state_ = parsing;
    }
    pOVar9 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar18 = pOVar9->type_size_min_;
    num = pOVar9->expected_min_ * iVar18;
    if (iVar18 <= num) {
      num = iVar18;
    }
    local_3e0._0_4_ = pOVar9->type_size_max_;
    tVar16 = detail::checked_multiply<int>((int *)local_3e0,pOVar9->expected_max_);
    local_384 = 0x20000000;
    if (tVar16) {
      local_384 = (int)local_3e0._0_8_;
    }
    if ((0x1ffffff < local_384) &&
       (pOVar9 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
       pOVar9->allow_extra_args_ == false)) {
      local_3e0._0_4_ = pOVar9->type_size_max_;
      tVar16 = detail::checked_multiply<int>((int *)local_3e0,pOVar9->expected_min_);
      local_384 = 0x20000000;
      if (tVar16) {
        local_384 = (int)local_3e0._0_8_;
      }
    }
    if (local_384 == 0) {
      pOVar9 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_1f8._M_allocated_capacity = (size_type)local_1e8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_2d8._M_allocated_capacity,
                 local_2d8._8_8_ + local_2d8._M_allocated_capacity);
      Option::get_flag_value((string *)local_3e0,pOVar9,(string *)&local_358,(string *)&local_1f8);
      if ((undefined1 *)local_1f8._M_allocated_capacity != local_1e8) {
        operator_delete((void *)local_1f8._M_allocated_capacity);
      }
      pOVar9 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_));
      Option::_add_result(pOVar9,&local_218,&pOVar9->results_);
      pOVar9->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      local_3a8._0_8_ =
           (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar10._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar10,
                   (Option **)local_3a8);
      }
      else {
        *iVar10._M_current = (Option *)local_3a8._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
        operator_delete((void *)local_3e0._0_8_);
      }
LAB_001331e6:
      iVar18 = 0;
    }
    else if (local_2d8._8_8_ == 0) {
      if ((char *)local_318._8_8_ == (char *)0x0) goto LAB_001331e6;
      pOVar9 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_318._M_allocated_capacity,
                 (char *)(local_318._8_8_ + local_318._M_allocated_capacity));
      iVar18 = Option::_add_result(pOVar9,&local_258,&pOVar9->results_);
      pOVar9->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      local_3e0._0_8_ =
           (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar10._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar10,
                   (Option **)local_3e0);
      }
      else {
        *iVar10._M_current = (Option *)local_3e0._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      ::std::__cxx11::string::_M_replace((ulong)&local_318,0,(char *)local_318._8_8_,0x1479ca);
    }
    else {
      pOVar9 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_2d8._M_allocated_capacity,
                 local_2d8._8_8_ + local_2d8._M_allocated_capacity);
      iVar18 = Option::_add_result(pOVar9,&local_238,&pOVar9->results_);
      pOVar9->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      local_3e0._0_8_ =
           (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar10._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar10,
                   (Option **)local_3e0);
      }
      else {
        *iVar10._M_current = (Option *)local_3e0._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
    }
    if (iVar18 < num) {
      local_380 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
      do {
        pbVar5 = *(pointer *)(pvVar33 + 8);
        if (*(pointer *)pvVar33 == pbVar5) {
          pAVar27 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_70,
                     (local_3f0->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          Option::get_type_name_abi_cxx11_
                    (&local_90,
                     (local_3f0->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          ArgumentMismatch::TypedAtLeast(pAVar27,&local_70,num,&local_90);
          __cxa_throw(pAVar27,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        local_3e0._0_8_ = local_3e0 + 0x10;
        pcVar6 = pbVar5[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3e0,pcVar6,pcVar6 + pbVar5[-1]._M_string_length);
        pbVar5 = *(pointer *)(pvVar33 + 8);
        *(pointer *)(pvVar33 + 8) = pbVar5 + -1;
        pcVar6 = pbVar5[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar5[-1].field_2) {
          operator_delete(pcVar6);
        }
        pOVar9 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_)
                  );
        iVar19 = Option::_add_result(pOVar9,&local_278,&pOVar9->results_);
        pOVar9->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        local_3a8._0_8_ =
             (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar10._M_current =
             (local_3c0->parse_order_).
             super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (local_3c0->parse_order_).
            super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    (local_380,iVar10,(Option **)local_3a8);
        }
        else {
          *iVar10._M_current = (Option *)local_3a8._0_8_;
          pppOVar2 = &(local_3c0->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar2 = *pppOVar2 + 1;
        }
        if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
          operator_delete((void *)local_3e0._0_8_);
        }
        iVar18 = iVar18 + iVar19;
        pvVar33 = local_3b8;
      } while (iVar18 < num);
    }
    if ((iVar18 < local_384) ||
       (((local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
      uVar34 = 0;
      for (puVar24 = (local_3c0->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          puVar24 !=
          (local_3c0->options_).
          super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; puVar24 = puVar24 + 1) {
        pOVar9 = (puVar24->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if (((((pOVar9->pname_)._M_string_length != 0) &&
             ((pOVar9->super_OptionBase<CLI::Option>).required_ == true)) &&
            (uVar30 = pOVar9->expected_min_ * pOVar9->type_size_min_, 0 < (int)uVar30)) &&
           (lVar32 = (long)*(pointer *)
                            ((long)&(pOVar9->results_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&(pOVar9->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl >> 5, (int)lVar32 < (int)uVar30)) {
          uVar34 = (uVar34 + uVar30) - lVar32;
        }
      }
      local_380 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&local_3c0->parse_order_;
      iVar19 = local_384;
      while (((iVar18 < iVar19 ||
              (((local_3f0->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true
              )) && ((*(pointer *)pvVar33 != *(pointer *)(pvVar33 + 8) &&
                     ((CVar20 = _recognize(local_3c0,*(pointer *)(pvVar33 + 8) + -1,false),
                      pvVar33 = local_3b8, CVar20 == NONE &&
                      (pbVar5 = *(pointer *)(local_3b8 + 8),
                      uVar34 < (ulong)((long)pbVar5 - *(long *)local_3b8 >> 5)))))))) {
        if (local_3c0->validate_optional_arguments_ == true) {
          local_3e0._0_8_ = local_3e0 + 0x10;
          pcVar6 = pbVar5[-1]._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3e0,pcVar6,pcVar6 + pbVar5[-1]._M_string_length);
          Option::_validate((string *)local_3a8,
                            (local_3f0->_M_t).
                            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                            .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                            (string *)local_3e0,0);
          ::std::__cxx11::string::operator=((string *)local_3e0,(string *)local_3a8);
          if ((Option *)local_3a8._0_8_ != (Option *)(local_3a8 + 0x10)) {
            operator_delete((void *)local_3a8._0_8_);
          }
          uVar31 = local_3e0._8_8_;
          if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
            operator_delete((void *)local_3e0._0_8_);
          }
          iVar19 = local_384;
          if (uVar31 != 0) break;
        }
        pOVar9 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_2b8._M_allocated_capacity = (size_type)local_2a8;
        pcVar6 = (*(pointer *)(pvVar33 + 8))[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,pcVar6,
                   pcVar6 + (*(pointer *)(pvVar33 + 8))[-1]._M_string_length);
        iVar21 = Option::_add_result(pOVar9,(string *)&local_2b8,&pOVar9->results_);
        pOVar9->current_option_state_ = parsing;
        if ((undefined1 *)local_2b8._M_allocated_capacity != local_2a8) {
          operator_delete((void *)local_2b8._M_allocated_capacity);
        }
        pvVar33 = local_3b8;
        local_3e0._0_8_ =
             (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar10._M_current =
             (local_3c0->parse_order_).
             super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (local_3c0->parse_order_).
            super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    (local_380,iVar10,(Option **)local_3e0);
        }
        else {
          *iVar10._M_current = (Option *)local_3e0._0_8_;
          pppOVar2 = &(local_3c0->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar2 = *pppOVar2 + 1;
        }
        pbVar5 = *(pointer *)(pvVar33 + 8);
        *(pointer *)(pvVar33 + 8) = pbVar5 + -1;
        pcVar6 = pbVar5[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar5[-1].field_2) {
          operator_delete(pcVar6);
        }
        iVar18 = iVar18 + iVar21;
      }
      pAVar29 = local_3c0;
      if ((*(pointer *)pvVar33 != *(pointer *)(pvVar33 + 8)) &&
         (CVar20 = _recognize(local_3c0,*(pointer *)(pvVar33 + 8) + -1,true),
         CVar20 == POSITIONAL_MARK)) {
        pbVar5 = *(pointer *)(pvVar33 + 8);
        *(pointer *)(pvVar33 + 8) = pbVar5 + -1;
        pcVar6 = pbVar5[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar5[-1].field_2) {
          operator_delete(pcVar6);
        }
      }
      if ((0 < iVar19) && (iVar18 == 0 && num == 0)) {
        local_198._M_string_length = 0;
        local_198.field_2._M_local_buf[0] = '\0';
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        Option::get_flag_value
                  ((string *)local_3e0,
                   (local_3f0->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,(string *)&local_358,
                   &local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        pOVar9 = (local_3f0->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_)
                  );
        Option::_add_result(pOVar9,&local_298,&pOVar9->results_);
        pOVar9->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        local_3a8._0_8_ =
             (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar10._M_current =
             (pAVar29->parse_order_).
             super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (pAVar29->parse_order_).
            super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                    (local_380,iVar10,(Option **)local_3a8);
        }
        else {
          *iVar10._M_current = (Option *)local_3a8._0_8_;
          pppOVar2 = &(pAVar29->parse_order_).
                      super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppOVar2 = *pppOVar2 + 1;
        }
        if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
          operator_delete((void *)local_3e0._0_8_);
        }
      }
    }
    if (0 < num) {
      pOVar9 = (local_3f0->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (iVar18 % pOVar9->type_size_max_ != 0) {
        if (pOVar9->type_size_max_ == pOVar9->type_size_min_) {
          pAVar27 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_b0,
                     (local_3f0->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          pOVar9 = (local_3f0->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          iVar18 = pOVar9->type_size_min_;
          Option::get_type_name_abi_cxx11_(&local_d0,pOVar9);
          ArgumentMismatch::PartialType(pAVar27,&local_b0,iVar18,&local_d0);
          __cxa_throw(pAVar27,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        local_1b8._8_8_ = 0;
        local_1a8._M_local_buf[0] = '\0';
        local_1b8._M_allocated_capacity = (size_type)&local_1a8;
        Option::_add_result(pOVar9,(string *)&local_1b8,&pOVar9->results_);
        pOVar9->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_allocated_capacity != &local_1a8) {
          operator_delete((void *)local_1b8._M_allocated_capacity);
        }
      }
    }
    pOVar9 = (local_3f0->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar9->trigger_on_result_ == true) {
      Option::run_callback(pOVar9);
    }
    bVar15 = true;
    if ((char *)local_318._8_8_ != (char *)0x0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3e0,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      ::std::__cxx11::string::operator=((string *)local_318._M_local_buf,(string *)local_3e0);
      if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
        operator_delete((void *)local_3e0._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pvVar33,(value_type *)&local_318);
    }
    goto LAB_00133da6;
  }
  psVar11 = (this->subcommands_).
            super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar26 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_3c0 = this, psVar26 != psVar11;
      psVar26 = psVar26 + 1) {
    pAVar29 = (psVar26->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar29->name_)._M_string_length == 0) && (pAVar29->disabled_ == false)) &&
       (bVar15 = _parse_arg(pAVar29,args,current_type,param_3), bVar15)) {
      pAVar29 = (psVar26->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      bVar15 = true;
      if (pAVar29->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar29,(long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 5);
      }
      goto LAB_00133da6;
    }
    this = local_3c0;
  }
  if (((current_type == SHORT) && (this->allow_non_standard_options_ != false)) &&
     (2 < (ulong)local_338._8_8_)) {
    local_3e0._8_8_ = 0;
    local_3e0[0x10] = '\0';
    local_3a8._8_8_ = 0;
    local_3a8._16_8_ = local_3a8._16_8_ & 0xffffffffffffff00;
    local_2e8 = 0x2d;
    local_2f8._8_8_ = 1;
    local_3e0._0_8_ = (Option *)(local_3e0 + 0x10);
    local_3a8._0_8_ = (Option *)(local_3a8 + 0x10);
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    plVar23 = (long *)::std::__cxx11::string::_M_append
                                (local_2f8._M_local_buf,local_338._M_allocated_capacity);
    puVar28 = (ulong *)(plVar23 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar23 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar28) {
      local_378.field_2._M_allocated_capacity = *puVar28;
      local_378.field_2._8_8_ = plVar23[3];
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    }
    else {
      local_378.field_2._M_allocated_capacity = *puVar28;
      local_378._M_dataplus._M_p = (pointer)*plVar23;
    }
    local_378._M_string_length = plVar23[1];
    *plVar23 = (long)puVar28;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    detail::split_long(&local_378,(string *)local_3e0,(string *)local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p);
    }
    if ((undefined2 *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity);
    }
    _Var7._M_current =
         (local_3c0->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Var8._M_current =
         (local_3c0->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    paVar4 = &local_1d8.narg_name.field_2;
    local_1d8.narg_name._M_dataplus._M_p = (pointer)paVar4;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1e8 + 0x10),local_3e0._0_8_,
               (pointer)(local_3e0._0_8_ + local_3e0._8_8_));
    local_3f0 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                ::std::
                find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                          (_Var7,_Var8,(anon_class_32_1_6b09f7e2_for__M_pred *)(local_1e8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.narg_name._M_dataplus._M_p != paVar4) {
      operator_delete(local_1d8.narg_name._M_dataplus._M_p);
    }
    puVar12 = (local_3c0->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_3f0 != puVar12) {
      ::std::__cxx11::string::_M_assign((string *)local_358._M_local_buf);
      ::std::__cxx11::string::_M_assign((string *)local_2d8._M_local_buf);
      local_318._8_8_ = (char *)0x0;
      *(char *)local_318._M_allocated_capacity = '\0';
    }
    if ((Option *)local_3a8._0_8_ != (Option *)(local_3a8 + 0x10)) {
      operator_delete((void *)local_3a8._0_8_);
    }
    this = local_3c0;
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
    args = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3b8;
    if (local_3f0 != puVar12) goto LAB_00132d38;
  }
  if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
    lVar32 = ::std::__cxx11::string::find((char)&local_358,0x2e);
    if (lVar32 != -1) {
      ::std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_358);
      local_3b0 = _find_subcommand(local_3c0,(string *)local_3e0,true,false);
      if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
        operator_delete((void *)local_3e0._0_8_);
      }
      pvVar33 = local_3b8;
      bVar15 = true;
      bVar17 = true;
      if (local_3b0 != (App *)0x0) {
        local_3e0._0_8_ = local_3e0 + 0x10;
        lVar32 = *(long *)(*(long *)(local_3b8 + 8) + -0x20);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3e0,lVar32,*(long *)(*(long *)(local_3b8 + 8) + -0x18) + lVar32);
        lVar32 = *(long *)(pvVar33 + 8);
        *(long *)(pvVar33 + 8) = lVar32 + -0x20;
        if (*(void **)(lVar32 + -0x20) != (void *)(lVar32 + -0x10)) {
          operator_delete(*(void **)(lVar32 + -0x20));
        }
        ::std::__cxx11::string::substr((ulong)local_3a8,(ulong)&local_358);
        ::std::__cxx11::string::operator=((string *)local_358._M_local_buf,(string *)local_3a8);
        pOVar9 = (Option *)(local_3a8 + 0x10);
        if ((Option *)local_3a8._0_8_ != pOVar9) {
          operator_delete((void *)local_3a8._0_8_);
        }
        if ((ulong)local_358._8_8_ < 2) {
          ::std::__cxx11::string::substr((ulong)local_3a8,(ulong)local_3e0);
          pAVar29 = local_3c0;
          *(char *)local_3a8._0_8_ = '-';
          if (2 < (ulong)local_3a8._8_8_) {
            ::std::__cxx11::string::substr((ulong)&local_378,(ulong)local_3a8);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(pvVar33,&local_378);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p);
            }
            ::std::__cxx11::string::resize((ulong)local_3a8,'\x02');
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pvVar33,(value_type *)local_3a8);
          if ((Option *)local_3a8._0_8_ != pOVar9) {
            operator_delete((void *)local_3a8._0_8_);
          }
          current_type = SHORT;
        }
        else {
          paVar4 = &local_378.field_2;
          local_378._M_dataplus._M_p = (pointer)paVar4;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"--","");
          ::std::__cxx11::string::substr((ulong)&local_2f8,(ulong)local_3e0);
          pAVar29 = local_3c0;
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != paVar4) {
            uVar31 = local_378.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < local_378._M_string_length + local_2f8._8_8_) {
            uVar34 = 0xf;
            if ((undefined2 *)local_2f8._M_allocated_capacity != &local_2e8) {
              uVar34 = CONCAT62(uStack_2e6,local_2e8);
            }
            if (uVar34 < local_378._M_string_length + local_2f8._8_8_) goto LAB_00133b0d;
            puVar25 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_378._M_dataplus._M_p);
          }
          else {
LAB_00133b0d:
            puVar25 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_378,local_2f8._M_allocated_capacity);
          }
          pOVar1 = (Option *)(puVar25 + 2);
          if ((Option *)*puVar25 == pOVar1) {
            local_3a8._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
            local_3a8._24_8_ = puVar25[3];
            local_3a8._0_8_ = pOVar9;
          }
          else {
            local_3a8._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
            local_3a8._0_8_ = (Option *)*puVar25;
          }
          local_3a8._8_8_ = puVar25[1];
          *puVar25 = pOVar1;
          puVar25[1] = 0;
          *(undefined1 *)&(pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p = 0;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (pvVar33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8);
          if ((Option *)local_3a8._0_8_ != pOVar9) {
            operator_delete((void *)local_3a8._0_8_);
          }
          if ((undefined2 *)local_2f8._M_allocated_capacity != &local_2e8) {
            operator_delete((void *)local_2f8._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != paVar4) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          current_type = LONG;
        }
        bVar17 = _parse_arg(local_3b0,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pvVar33,current_type,true);
        if (bVar17) {
          if (local_3b0->silent_ == false) {
            __position._M_current =
                 (pAVar29->parsed_subcommands_).
                 super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pAVar29->parsed_subcommands_).
                super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*const&>
                        ((vector<CLI::App*,std::allocator<CLI::App*>> *)
                         &pAVar29->parsed_subcommands_,__position,&local_3b0);
            }
            else {
              *__position._M_current = local_3b0;
              pppAVar3 = &(pAVar29->parsed_subcommands_).
                          super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppAVar3 = *pppAVar3 + 1;
            }
          }
          increment_parsed(pAVar29);
          _trigger_pre_parse(pAVar29,(long)*(pointer *)(local_3b8 + 8) - *(long *)local_3b8 >> 5);
          if ((local_3b0->parse_complete_callback_).super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            _process_env(local_3b0);
            _process_callbacks(local_3b0);
            _process_help_flags(local_3b0,false,false);
            _process_requirements(local_3b0);
            run_callback(local_3b0,false,true);
          }
        }
        else {
          pbVar5 = *(pointer *)(local_3b8 + 8);
          *(pointer *)(local_3b8 + 8) = pbVar5 + -1;
          pcVar6 = pbVar5[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 != &pbVar5[-1].field_2) {
            operator_delete(pcVar6);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3b8,(value_type *)local_3e0);
        }
        if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
          operator_delete((void *)local_3e0._0_8_);
        }
        bVar17 = !bVar17;
      }
      args = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3b8;
      if (!bVar17) goto LAB_00133da6;
    }
    pAVar29 = local_3c0;
    if (!param_3) {
      if ((local_3c0->parent_ == (App *)0x0) ||
         (pAVar14 = local_3c0->parent_, local_3c0->fallthrough_ != true)) {
        pbVar5 = *(pointer *)((long)args + 8);
        *(pointer *)((long)args + 8) = pbVar5 + -1;
        pcVar6 = pbVar5[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 != &pbVar5[-1].field_2) {
          operator_delete(pcVar6);
        }
        local_3e0._0_4_ = current_type;
        if (pAVar29->allow_extras_ == false) {
          psVar26 = (pAVar29->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar11 = (pAVar29->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar26 != psVar11) {
            bVar15 = false;
            do {
              peVar13 = (psVar26->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if (((peVar13->name_)._M_string_length == 0) && (peVar13->allow_extras_ == true)) {
                ::std::
                vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                          ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                            *)&peVar13->missing_,(Classifier *)local_3e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_338);
                if (!bVar15) goto LAB_00133edb;
                break;
              }
              psVar26 = psVar26 + 1;
              bVar15 = psVar26 == psVar11;
            } while (!bVar15);
          }
        }
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&pAVar29->missing_,(Classifier *)local_3e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338);
LAB_00133edb:
        bVar15 = true;
      }
      else {
        do {
          pAVar29 = pAVar14;
          if (pAVar29->parent_ == (App *)0x0) break;
          pAVar14 = pAVar29->parent_;
        } while ((pAVar29->name_)._M_string_length == 0);
        bVar15 = _parse_arg(pAVar29,args,current_type,false);
      }
      goto LAB_00133da6;
    }
  }
  bVar15 = false;
LAB_00133da6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_allocated_capacity != &local_308) {
    operator_delete((void *)local_318._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_allocated_capacity != &local_2c8) {
    operator_delete((void *)local_2d8._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_allocated_capacity != &local_348) {
    operator_delete((void *)local_358._M_allocated_capacity);
  }
  if ((char *)local_338._M_allocated_capacity != local_328) {
    operator_delete((void *)local_338._M_allocated_capacity);
  }
  return bVar15;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}